

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moremagic.c
# Opt level: O1

void spell_waterbreath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    send_to_char("They can already breathe underwater.\n\r",ch);
    return;
  }
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_drowning);
  if (bVar1) {
    act("You feel relieved as you begin breathing water like you would air.",(CHAR_DATA *)vo,
        (void *)0x0,(void *)0x0,3);
    act("$n looks relieved as $e begins breathing water like $e would air.",(CHAR_DATA *)vo,
        (void *)0x0,(void *)0x0,0);
    switchD_002e4026::default((CHAR_DATA *)vo,(int)gsn_drowning);
  }
  init_affect(&local_90);
  local_90.where = 0;
  local_90.type = (short)sn;
  local_90.aftype = get_spell_aftype(ch);
  local_90.duration =
       (short)(uint)((ulong)((long)level * 0x66666667) >> 0x21) - (short)(level >> 0x1f);
  local_90.location = 0;
  local_90.modifier = 0;
  local_90.end_fun = waterbreath_end;
  local_90.bitvector[0]._3_1_ = local_90.bitvector[0]._3_1_ | 8;
  local_90.level = (short)level;
  affect_to_char((CHAR_DATA *)vo,&local_90);
  send_to_char("You feel more adept at breathing underwater.\n\r",(CHAR_DATA *)vo);
  if (ch != (CHAR_DATA *)vo) {
    act("You give $N the ability to breathe underwater.",ch,(void *)0x0,vo,3);
  }
  return;
}

Assistant:

void spell_waterbreath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (is_affected(victim, sn))
	{
		send_to_char("They can already breathe underwater.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_drowning))
	{
		act("You feel relieved as you begin breathing water like you would air.", victim, 0, 0, TO_CHAR);
		act("$n looks relieved as $e begins breathing water like $e would air.", victim, 0, 0, TO_ROOM);
		affect_strip(victim, gsn_drowning);
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = get_spell_aftype(ch);
	af.level = level;
	af.duration = level / 5;
	af.location = 0;
	af.modifier = 0;
	af.end_fun = waterbreath_end;

	SET_BIT(af.bitvector, AFF_WATERBREATH);

	affect_to_char(victim, &af);

	send_to_char("You feel more adept at breathing underwater.\n\r", victim);

	if (ch != victim)
		act("You give $N the ability to breathe underwater.", ch, 0, victim, TO_CHAR);
}